

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkToLogic(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  long *plVar1;
  uint __line;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    if (pNtk->nObjCounts[9] == 0) {
      if (pNtk->nObjCounts[10] == 0) {
        pAVar3 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,pNtk->ntkFunc);
        for (iVar8 = 0; iVar2 = pNtk->vObjs->nSize, iVar8 < iVar2; iVar8 = iVar8 + 1) {
          pAVar4 = Abc_NtkObj(pNtk,iVar8);
          if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
            Abc_NtkDupObj(pAVar3,pAVar4,0);
            pObj = (pAVar4->field_6).pCopy;
            pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray]);
            Abc_ObjAssignName(pObj,pcVar6,(char *)0x0);
          }
        }
        for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
          pAVar4 = Abc_NtkObj(pNtk,iVar8);
          if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
            for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
              plVar1 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]];
              Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                         (long)*(int *)plVar1[4] * 8) + 0x40));
            }
          }
          iVar2 = pNtk->vObjs->nSize;
        }
        Abc_NtkFinalize(pNtk,pAVar3);
        Abc_NtkLogicMakeSimpleCos(pAVar3,0);
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          pAVar5 = Abc_NtkToLogic(pNtk->pExdc);
          pAVar3->pExdc = pAVar5;
        }
        iVar8 = Abc_NtkCheck(pAVar3);
        if (iVar8 == 0) {
          fwrite("Abc_NtkToLogic(): Network check has failed.\n",0x2c,1,_stdout);
        }
        return pAVar3;
      }
      pcVar6 = "Abc_NtkBlackboxNum(pNtk) == 0";
      __line = 0x40;
    }
    else {
      pcVar6 = "Abc_NtkWhiteboxNum(pNtk) == 0";
      __line = 0x3f;
    }
  }
  else {
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      pAVar3 = Abc_NtkAigToLogicSop(pNtk);
      return pAVar3;
    }
    pcVar6 = "Abc_NtkIsNetlist(pNtk)";
    __line = 0x3c;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                ,__line,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkToLogic( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // consider the case of the AIG
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkAigToLogicSop( pNtk );
    assert( Abc_NtkIsNetlist(pNtk) );
    // consider simple case when there is hierarchy
//    assert( pNtk->pDesign == NULL );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, pNtk->ntkFunc );
    // duplicate the nodes 
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    // reconnect the internal nodes in the new network
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pFanin)->pCopy );
    // collect the CO nodes
    Abc_NtkFinalize( pNtk, pNtkNew );
    // fix the problem with CO pointing directly to CIs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToLogic( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkToLogic(): Network check has failed.\n" );
    return pNtkNew;
}